

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<unsigned_int,_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<unsigned_int,_fmt::v6::basic_format_specs<char>_> *this)

{
  format_specs specs;
  string_view prefix;
  num_writer f;
  char cVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  undefined8 uVar10;
  reference pcVar11;
  basic_writer<fmt::v6::buffer_range<char>_> *this_00;
  char *pcVar12;
  long *in_RDI;
  string_view sVar13;
  const_iterator group;
  int size;
  int num_digits;
  char sep;
  string groups;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff08;
  locale_ref in_stack_ffffffffffffff10;
  locale_ref in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  size_t sVar14;
  undefined4 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc4 [12];
  undefined8 uVar15;
  string local_28 [40];
  
  uVar15 = *(undefined8 *)(*in_RDI + 8);
  grouping<char>(in_stack_ffffffffffffff18);
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    sVar14 = *(size_t *)(*in_RDI + 8);
    cVar1 = thousands_sep<char>(in_stack_ffffffffffffff10);
    if (cVar1 == '\0') {
      on_dec((int_writer<unsigned_int,_fmt::v6::basic_format_specs<char>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    }
    else {
      iVar5 = count_digits(*(uint32_t *)(in_RDI + 2));
      iVar6 = iVar5;
      _Var9._M_current = (char *)std::__cxx11::string::cbegin();
      while( true ) {
        uVar10 = std::__cxx11::string::cend();
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_ffffffffffffff10.locale_,in_stack_ffffffffffffff08);
        bVar4 = false;
        if (bVar2) {
          iVar7 = iVar6;
          pcVar11 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&stack0xffffffffffffffa0);
          bVar4 = false;
          bVar2 = *pcVar11 < iVar6;
          iVar6 = iVar7;
          if (bVar2) {
            pcVar11 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&stack0xffffffffffffffa0);
            bVar4 = false;
            iVar6 = iVar7;
            if ('\0' < *pcVar11) {
              pcVar11 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&stack0xffffffffffffffa0);
              cVar1 = *pcVar11;
              cVar3 = max_value<char>();
              bVar4 = cVar1 != cVar3;
              iVar6 = iVar7;
            }
          }
        }
        if (!bVar4) break;
        iVar5 = iVar5 + 1;
        pcVar11 = __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&stack0xffffffffffffffa0);
        iVar6 = iVar6 - *pcVar11;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&stack0xffffffffffffffa0);
      }
      this_00 = (basic_writer<fmt::v6::buffer_range<char>_> *)std::__cxx11::string::cend();
      bVar4 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_ffffffffffffff10.locale_,in_stack_ffffffffffffff08);
      if (bVar4) {
        iVar7 = iVar6 + -1;
        pcVar12 = (char *)std::__cxx11::string::back();
        iVar5 = iVar7 / (int)*pcVar12 + iVar5;
      }
      sVar13 = get_prefix((int_writer<unsigned_int,_fmt::v6::basic_format_specs<char>_> *)0x22bbff);
      prefix.data_._4_4_ = iVar6;
      prefix.data_._0_4_ = iVar5;
      prefix.size_ = sVar14;
      specs._8_8_ = _Var9._M_current;
      specs.width = (int)uVar10;
      specs.precision = (int)((ulong)uVar10 >> 0x20);
      f.size = in_stack_ffffffffffffffc4._0_4_;
      f.groups = (string *)in_stack_ffffffffffffffc4._4_8_;
      f.abs_value = in_stack_ffffffffffffffc0;
      f._16_8_ = uVar15;
      basic_writer<fmt::v6::buffer_range<char>>::
      write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::num_writer>
                (this_00,sVar13.size_._4_4_,prefix,specs,f);
    }
  }
  else {
    on_dec((int_writer<unsigned_int,_fmt::v6::basic_format_specs<char>_> *)
           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }